

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O1

void __thiscall kratos::PassManager::run_passes(PassManager *this,Generator *generator)

{
  key_type *pkVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fn_name;
  long lVar2;
  mapped_type *__x;
  ostream *poVar3;
  _Manager_operation extraout_EDX;
  ulong uVar4;
  ulong uVar5;
  key_type *__k;
  undefined1 local_68 [8];
  mapped_type fn;
  
  if (this[0x48] == (PassManager)0x1) {
    uVar5 = 0;
    for (lVar2 = *(long *)(this + 0x30); lVar2 != *(long *)(this + 0x38); lVar2 = lVar2 + 0x20) {
      uVar4 = (ulong)*(uint *)(lVar2 + 8);
      if ((int)*(uint *)(lVar2 + 8) < (int)uVar5) {
        uVar4 = uVar5;
      }
      uVar5 = uVar4;
    }
  }
  else {
    uVar5 = 0;
  }
  __k = *(key_type **)(this + 0x30);
  pkVar1 = *(key_type **)(this + 0x38);
  while( true ) {
    if (__k == pkVar1) {
      return;
    }
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
          ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                *)this,__k);
    std::function<void_(kratos::Generator_*)>::function
              ((function<void_(kratos::Generator_*)> *)local_68,__x);
    std::chrono::_V2::system_clock::now();
    fn._M_invoker = (_Invoker_type)generator;
    if (fn.super__Function_base._M_functor._8_8_ == 0) break;
    (*fn.super__Function_base._M_manager)
              ((_Any_data *)local_68,(_Any_data *)&fn._M_invoker,extraout_EDX);
    if (this[0x48] == (PassManager)0x1) {
      std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[name]: ",8);
      lVar2 = std::cout;
      *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                    *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
      *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = uVar5;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(__k->_M_dataplus)._M_p,__k->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t[time]: ",9);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms",3);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if (fn.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)fn.super__Function_base._M_functor._8_8_)(local_68,local_68,3);
    }
    __k = __k + 1;
  }
  std::__throw_bad_function_call();
}

Assistant:

void PassManager::run_passes(Generator* generator) {
    // compute padding
    int string_size = 0;
    if (collect_perf_) {
        for (auto const& fn_name : passes_order_) {
            auto s = static_cast<int>(fn_name.size());
            if (s > string_size) {
                string_size = s;
            }
        }
    }

    for (const auto& fn_name : passes_order_) {
        auto fn = passes_.at(fn_name);
        auto start = std::chrono::system_clock::now();
        fn(generator);

        if (collect_perf_) {
            auto end = std::chrono::system_clock::now();
            auto diff = end - start;
            auto time = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "[name]: " << std::left << std::setw(string_size) << fn_name
                      << "\t[time]: " << time << " ms" << std::endl;
        }
    }
}